

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NodeCollapsePermMap(Abc_Obj_t *pNode,Abc_Obj_t *pSkip,Vec_Ptr_t *vFanins,int *pPerm)

{
  Abc_Obj_t *pFanin;
  int iVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < vFanins->nSize; lVar2 = lVar2 + 1) {
    pPerm[lVar2] = (int)lVar2;
  }
  lVar2 = 0;
  do {
    if ((pNode->vFanins).nSize <= lVar2) {
      return 1;
    }
    pFanin = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar2]];
    if (pFanin != pSkip) {
      iVar1 = Abc_ObjFaninNumberNew(vFanins,pFanin);
      pPerm[lVar2] = iVar1;
      if (iVar1 == -1) {
        return 0;
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int Abc_NodeCollapsePermMap( Abc_Obj_t * pNode, Abc_Obj_t * pSkip, Vec_Ptr_t * vFanins, int * pPerm )
{
    Abc_Obj_t * pFanin;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanins); i++ )
        pPerm[i] = i;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin == pSkip )
            continue;
        pPerm[i] = Abc_ObjFaninNumberNew( vFanins, pFanin );
        if ( pPerm[i] == -1 )
            return 0;
    }
    return 1;
}